

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

void P_SpawnTeleportFog(AActor *mobj,DVector3 *pos,bool beforeTele,bool setTarget)

{
  uint uVar1;
  PClassActor *local_78;
  double local_70;
  PClassActor *local_68;
  TVector2<double> local_60;
  TVector3<double> local_50;
  TFlags<ActorFlag,_unsigned_int> local_34;
  double local_30;
  double fogDelta;
  AActor *mo;
  bool setTarget_local;
  DVector3 *pDStack_18;
  bool beforeTele_local;
  DVector3 *pos_local;
  AActor *mobj_local;
  
  if (beforeTele) {
    local_68 = mobj->TeleFogSourceType;
  }
  else {
    local_68 = mobj->TeleFogDestType;
  }
  mo._6_1_ = setTarget;
  mo._7_1_ = beforeTele;
  pDStack_18 = pos;
  pos_local = (DVector3 *)mobj;
  if (local_68 == (PClassActor *)0x0) {
    fogDelta = 0.0;
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_34,
               (int)mobj +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
    if (uVar1 == 0) {
      local_70 = gameinfo.telefogheight;
    }
    else {
      local_70 = 0.0;
    }
    local_30 = local_70;
    if ((mo._7_1_ & 1) == 0) {
      local_78 = (PClassActor *)pos_local[0x2c].Z;
    }
    else {
      local_78 = (PClassActor *)pos_local[0x2c].Y;
    }
    TVector2<double>::TVector2(&local_60,pDStack_18);
    TVector3<double>::TVector3(&local_50,&local_60,pDStack_18->Z + local_30);
    fogDelta = (double)Spawn(local_78,&local_50,ALLOW_REPLACE);
  }
  if ((fogDelta != 0.0) && ((mo._6_1_ & 1) != 0)) {
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)fogDelta + 0x208),(AActor *)pos_local);
  }
  return;
}

Assistant:

void P_SpawnTeleportFog(AActor *mobj, const DVector3 &pos, bool beforeTele, bool setTarget)
{
	AActor *mo;
	if ((beforeTele ? mobj->TeleFogSourceType : mobj->TeleFogDestType) == NULL)
	{
		//Do nothing.
		mo = NULL;
	}
	else
	{
		double fogDelta = mobj->flags & MF_MISSILE ? 0 : TELEFOGHEIGHT;
		mo = Spawn((beforeTele ? mobj->TeleFogSourceType : mobj->TeleFogDestType), DVector3(pos, pos.Z + fogDelta), ALLOW_REPLACE);
	}

	if (mo != NULL && setTarget)
		mo->target = mobj;
}